

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O2

void EMIT_OP_REG(CodeGenGenericContext *ctx,x86Command op,x86Reg reg1)

{
  x86Instruction *pxVar1;
  
  switch(op) {
  case o_call:
    ctx->genRegRead[reg1] = true;
    CodeGenGenericContext::KillUnreadRegisters(ctx);
    CodeGenGenericContext::InvalidateState(ctx);
    break;
  case o_ret:
  case o_add:
  case o_adc:
  case o_sub:
  case o_sbb:
  case o_shl:
  case o_and:
  case o_or:
  case o_xor:
  case o_cmp:
  case o_test:
switchD_0027b4a9_caseD_1b:
    __assert_fail("!\"unknown instruction\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/CodeGen_X86.cpp"
                  ,0x3cb,"void EMIT_OP_REG(CodeGenGenericContext &, x86Command, x86Reg)");
  case o_imul:
switchD_0027b4a9_caseD_21:
    ctx->genRegRead[reg1] = true;
    CodeGenGenericContext::ReadAndModifyRegister(ctx,rEAX);
    CodeGenGenericContext::OverwriteRegisterWithUnknown(ctx,rEDX);
    break;
  case o_idiv:
switchD_0027b4a9_caseD_22:
    ctx->genRegRead[reg1] = true;
    CodeGenGenericContext::ReadAndModifyRegister(ctx,rEAX);
    CodeGenGenericContext::ReadAndModifyRegister(ctx,rEDX);
    ctx->genRegRead[1] = true;
    ctx->genRegRead[4] = true;
    break;
  case o_sal:
  case o_sar:
switchD_0027b4a9_caseD_24:
    ctx->genRegRead[3] = true;
  case o_neg:
  case o_not:
  case o_setl:
  case o_setg:
  case o_setle:
  case o_setge:
  case o_sete:
  case o_setne:
  case o_setz:
  case o_setnz:
switchD_0027b4a9_caseD_1c:
    CodeGenGenericContext::ReadAndModifyRegister(ctx,reg1);
    break;
  default:
    switch(op) {
    case o_kill_register:
      CodeGenGenericContext::KillRegister(ctx,reg1);
      break;
    case o_set_tracking:
    case o_mov64:
    case o_add64:
    case o_sub64:
      goto switchD_0027b4a9_caseD_1b;
    case o_neg64:
    case o_not64:
      goto switchD_0027b4a9_caseD_1c;
    case o_imul64:
      goto switchD_0027b4a9_caseD_21;
    case o_idiv64:
      goto switchD_0027b4a9_caseD_22;
    case o_sal64:
    case o_sar64:
      goto switchD_0027b4a9_caseD_24;
    default:
      if (op == o_push) {
        if (ctx->skipTracking != false) break;
      }
      else {
        if (op != o_pop) goto switchD_0027b4a9_caseD_1b;
        if (ctx->skipTracking != false) break;
        CodeGenGenericContext::OverwriteRegisterWithUnknown(ctx,reg1);
      }
    case o_read_register:
      ctx->genRegRead[reg1] = true;
    }
  }
  pxVar1 = ctx->x86Op;
  pxVar1->name = op;
  (pxVar1->argA).type = argReg;
  (pxVar1->argA).field_1.reg = reg1;
  pxVar1 = ctx->x86Op;
  (pxVar1->argB).type = argNone;
  ctx->x86Op = pxVar1 + 1;
  return;
}

Assistant:

void EMIT_OP_REG(CodeGenGenericContext &ctx, x86Command op, x86Reg reg1)
{
#ifdef NULLC_OPTIMIZE_X86
	switch(op)
	{
	case o_call:
		ctx.ReadRegister(reg1);

		ctx.KillUnreadRegisters();

		ctx.InvalidateState();
		break;
	case o_setl:
	case o_setg:
	case o_setle:
	case o_setge:
	case o_sete:
	case o_setne:
	case o_setz:
	case o_setnz:
		ctx.ReadAndModifyRegister(reg1); // Since instruction sets only lower bits, it 'reads' the rest
		break;
	case o_imul:
	case o_imul64:
		// TODO: check if direct operation with memory is possible

		ctx.ReadRegister(reg1);

		ctx.ReadAndModifyRegister(rEAX);
		ctx.OverwriteRegisterWithUnknown(rEDX); // Don't care about top bits here
		break;
	case o_idiv:
	case o_idiv64:
		// TODO: check if direct operation with memory is possible

		ctx.ReadRegister(reg1);

		ctx.ReadAndModifyRegister(rEAX);
		ctx.ReadAndModifyRegister(rEDX);

		// Implicitly read the result so when one of the registers is killed, it will not remove the instruction (there's room for improvement)
		ctx.ReadRegister(rEAX);
		ctx.ReadRegister(rEDX);
		break;
	case o_neg:
	case o_not:
	case o_neg64:
	case o_not64:
		ctx.ReadAndModifyRegister(reg1);
		break;
	case o_push:
		if(ctx.skipTracking)
			break;

		ctx.ReadRegister(reg1);
		break;
	case o_pop:
		if(ctx.skipTracking)
			break;

		ctx.OverwriteRegisterWithUnknown(reg1);

		// Push and pop are part of the frame setup, so implicitly use the register so it won't be removed
		ctx.ReadRegister(reg1);
		break;
	case o_sal:
	case o_sar:
	case o_sal64:
	case o_sar64:
		ctx.ReadRegister(rECX);

		ctx.ReadAndModifyRegister(reg1);
		break;
	case o_read_register:
		ctx.ReadRegister(reg1);
		break;
	case o_kill_register:
		ctx.KillRegister(reg1);
		break;
	default:
		assert(!"unknown instruction");
	}
#else
	if(op == o_call)
		ctx.InvalidateState();
#endif

	ctx.x86Op->name = op;
	ctx.x86Op->argA.type = x86Argument::argReg;
	ctx.x86Op->argA.reg = reg1;
	ctx.x86Op->argB.type = x86Argument::argNone;
	ctx.x86Op++;
}